

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson.c
# Opt level: O3

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  undefined4 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  uint uVar4;
  double dVar5;
  
  plVar2 = (long *)N_VClone(SUB84(t,0));
  uVar3 = N_VClone(y);
  puVar1 = *(undefined4 **)(*plVar2 + 0x10);
  *puVar1 = 0x6e615b42;
  puVar1[1] = 0x3e565ea4;
  puVar1[2] = 0x6bf402c4;
  puVar1[3] = 0x3d36ee95;
  *(undefined8 *)(puVar1 + 4) = 0x3feffffff4d0aac0;
  N_VAbs(plVar2,uVar3);
  N_VScale(0xeb1c432d,uVar3,uVar3);
  N_VAddConst(0xe1796495,uVar3,uVar3);
  dVar5 = (double)N_VMin(uVar3);
  if (dVar5 <= 0.0) {
    check_ans_cold_1();
    uVar4 = 0xffffffff;
  }
  else {
    N_VInv(uVar3,uVar3);
    N_VLinearSum(0,0xbff0000000000000,y,plVar2,plVar2);
    dVar5 = (double)N_VWrmsNorm(plVar2,uVar3);
    if (1.0 <= dVar5) {
      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
    }
    uVar4 = (uint)(1.0 <= dVar5);
    N_VDestroy(plVar2);
    N_VDestroy(uVar3);
  }
  return uVar4;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0; /* answer pass (0) or fail (1) flag */
  N_Vector ref;     /* reference solution vector        */
  N_Vector ewt;     /* error weight vector              */
  sunrealtype err;  /* wrms error                       */
  sunrealtype ZERO = SUN_RCONST(0.0);
  sunrealtype ONE  = SUN_RCONST(1.0);

  /* create reference solution and error weight vectors */
  ref = N_VClone(y);
  ewt = N_VClone(y);

  /* set the reference solution data */
  NV_Ith_S(ref, 0) = SUN_RCONST(2.0833403356917897e-08);
  NV_Ith_S(ref, 1) = SUN_RCONST(8.1470714598028223e-14);
  NV_Ith_S(ref, 2) = SUN_RCONST(9.9999997916651040e-01);

  /* compute the error weight vector */
  N_VAbs(ref, ewt);
  N_VScale(rtol, ewt, ewt);
  N_VAddConst(ewt, atol, ewt);
  if (N_VMin(ewt) <= ZERO)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    return (-1);
  }
  N_VInv(ewt, ewt);

  /* compute the solution error */
  N_VLinearSum(ONE, y, -ONE, ref, ref);
  err = N_VWrmsNorm(ref, ewt);

  /* is the solution within the tolerances? */
  passfail = (err < ONE) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  /* Free vectors */
  N_VDestroy(ref);
  N_VDestroy(ewt);

  return (passfail);
}